

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O0

void __thiscall CaDiCaL::Proof::delete_unit_clause(Proof *this,uint64_t id,int lit)

{
  uint64_t in_RSI;
  Proof *in_RDI;
  Proof *unaff_retaddr;
  int in_stack_ffffffffffffffdc;
  
  add_literal(in_RDI,in_stack_ffffffffffffffdc);
  in_RDI->clause_id = in_RSI;
  in_RDI->redundant = false;
  delete_clause(unaff_retaddr);
  return;
}

Assistant:

void Proof::delete_unit_clause (uint64_t id, const int lit) {
  LOG ("PROOF deleting unit from proof %d", lit);
  assert (clause.empty ());
  add_literal (lit);
  clause_id = id;
  redundant = false;
  delete_clause ();
}